

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O0

void __thiscall Liby::PollerSelect::loop_once(PollerSelect *this,Timestamp *ts)

{
  bool bVar1;
  timeval *ptVar2;
  Logger *this_00;
  int *piVar3;
  Channel *pCVar4;
  double __x;
  bool flag;
  Channel *ch;
  anon_class_8_1_8991fb9c local_240;
  function<void_()> local_238;
  undefined1 local_218 [8];
  DeferCaller deferCaller;
  int fd;
  int nready;
  fd_set eset;
  fd_set wset;
  fd_set rset;
  undefined1 local_60 [8];
  Timestamp inter;
  undefined1 local_40 [8];
  Timestamp now;
  timeval *pto;
  timeval timeout;
  Timestamp *ts_local;
  PollerSelect *this_local;
  
  timeout.tv_usec = (__suseconds_t)ts;
  Poller::runNextLoopHandlers(&this->super_Poller);
  now.tv_.tv_usec = 0;
  if (timeout.tv_usec != 0) {
    Timestamp::now();
    bVar1 = operator<((Timestamp *)timeout.tv_usec,(Timestamp *)local_40);
    if (bVar1) {
      inter.tv_.tv_usec = 0;
      pto = (timeval *)0x0;
      timeout.tv_sec = 0;
    }
    else {
      operator-((Liby *)local_60,(Timestamp *)timeout.tv_usec,(Timestamp *)local_40);
      ptVar2 = (timeval *)Timestamp::sec((Timestamp *)local_60);
      timeout.tv_sec = Timestamp::usec((Timestamp *)local_60);
      pto = ptVar2;
    }
    now.tv_.tv_usec = (__suseconds_t)&pto;
  }
  memcpy(wset.fds_bits + 0xf,&this->rset_,0x80);
  memcpy(eset.fds_bits + 0xf,&this->wset_,0x80);
  memcpy(&fd,&this->eset_,0x80);
  deferCaller.functor_._M_invoker._4_4_ =
       select(this->maxfd_,(fd_set *)(wset.fds_bits + 0xf),(fd_set *)(eset.fds_bits + 0xf),
              (fd_set *)&fd,(timeval *)now.tv_.tv_usec);
  if (deferCaller.functor_._M_invoker._4_4_ == -1) {
    this_00 = Logger::getLogger();
    piVar3 = __errno_location();
    strerror(*piVar3);
    Logger::log(this_00,__x);
  }
  for (deferCaller.functor_._M_invoker._0_4_ = 0;
      (int)deferCaller.functor_._M_invoker < this->maxfd_ &&
      0 < deferCaller.functor_._M_invoker._4_4_;
      deferCaller.functor_._M_invoker._0_4_ = (int)deferCaller.functor_._M_invoker + 1) {
    local_240.this = this;
    std::function<void()>::function<Liby::PollerSelect::loop_once(Liby::Timestamp*)::__0,void>
              ((function<void()> *)&local_238,&local_240);
    DeferCaller::DeferCaller((DeferCaller *)local_218,&local_238);
    std::function<void_()>::~function(&local_238);
    pCVar4 = Poller::getChannel(&this->super_Poller,(int)deferCaller.functor_._M_invoker);
    if (pCVar4 != (Channel *)0x0) {
      if ((*(ulong *)(&fd + (long)((int)deferCaller.functor_._M_invoker / 0x40) * 2) &
          1L << ((byte)((long)(int)deferCaller.functor_._M_invoker % 0x40) & 0x3f)) == 0) {
        bVar1 = (wset.fds_bits[(long)((int)deferCaller.functor_._M_invoker / 0x40) + 0xf] &
                1L << ((byte)((long)(int)deferCaller.functor_._M_invoker % 0x40) & 0x3f)) != 0;
        if (bVar1) {
          Channel::handleReadEvent(pCVar4);
        }
        if (((eset.fds_bits[(long)((int)deferCaller.functor_._M_invoker / 0x40) + 0xf] &
             1L << ((byte)((long)(int)deferCaller.functor_._M_invoker % 0x40) & 0x3f)) != 0) &&
           (pCVar4 = Poller::getChannel(&this->super_Poller,(int)deferCaller.functor_._M_invoker),
           pCVar4 != (Channel *)0x0)) {
          bVar1 = true;
          Channel::handleWritEvent(pCVar4);
        }
        if (bVar1) {
          deferCaller.functor_._M_invoker._4_4_ = deferCaller.functor_._M_invoker._4_4_ + -1;
        }
      }
      else {
        Channel::handleErroEvent(pCVar4);
      }
    }
    DeferCaller::~DeferCaller((DeferCaller *)local_218);
  }
  Poller::runAfterLoopHandlers(&this->super_Poller);
  return;
}

Assistant:

void PollerSelect::loop_once(Timestamp *ts) {
    runNextLoopHandlers();

    struct timeval timeout;
    struct timeval *pto = nullptr;
    if (ts != nullptr) {
        Timestamp now = Timestamp::now();
        if (*ts < now) {
            timeout = {0, 0};
        } else {
            Timestamp inter = *ts - now;
            timeout = {.tv_sec = inter.sec(), .tv_usec = inter.usec()};
        }
        pto = &timeout;
    }

    fd_set rset = rset_;
    fd_set wset = wset_;
    fd_set eset = eset_;

    int nready = ::select(maxfd_, &rset, &wset, &eset, pto);
    errorif(nready == -1, "select: %s", ::strerror(errno));

    for (int fd = 0; fd < maxfd_ && nready > 0; fd++) {
        DeferCaller deferCaller([this] { runNextTickHandlers(); });

        Channel *ch = getChannel(fd);
        if (ch == nullptr)
            continue;

        bool flag = false;
        if (FD_ISSET(fd, &eset)) {
            flag = true;
            ch->handleErroEvent();
            continue;
        }
        if (FD_ISSET(fd, &rset)) {
            flag = true;
            ch->handleReadEvent();
        }
        if (FD_ISSET(fd, &wset) && (ch = getChannel(fd)) != nullptr) {
            flag = true;
            ch->handleWritEvent();
        }

        if (flag == true) {
            nready--;
        }
    }

    runAfterLoopHandlers();
}